

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::configureFromVector
          (CoreBroker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string_view message;
  bool bVar1;
  int iVar2;
  BrokerBase *this_00;
  undefined8 uVar3;
  BrokerBase *in_RSI;
  long in_RDI;
  int result;
  undefined4 in_stack_ffffffffffffff78;
  BrokerState in_stack_ffffffffffffff7c;
  BrokerState in_stack_ffffffffffffff7e;
  BrokerBase *in_stack_ffffffffffffff80;
  BrokerState newState;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  undefined4 in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar4;
  BrokerBase *this_02;
  
  this_02 = in_RSI;
  bVar1 = BrokerBase::transitionBrokerState
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c);
  if (bVar1) {
    this_00 = (BrokerBase *)(in_RDI + 8);
    this_01 = &local_30;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT26(in_stack_ffffffffffffff7e,
                         CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
    newState = (BrokerState)((ulong)in_stack_ffffffffffffff80 >> 0x30);
    iVar2 = BrokerBase::parseArgs
                      (this_02,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01);
    if (iVar2 == 0) {
      (**(code **)(*(long *)(in_RDI + 8) + 0x10))(in_RDI + 8);
    }
    else {
      iVar4 = iVar2;
      BrokerBase::setBrokerState(this_00,newState);
      if (iVar4 < 0) {
        uVar3 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this_01,(char *)this_00);
        message._M_len._4_4_ = iVar2;
        message._M_len._0_4_ = in_stack_ffffffffffffff98;
        message._M_str = (char *)in_RSI;
        InvalidParameter::InvalidParameter((InvalidParameter *)this_01,message);
        __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::configureFromVector(std::vector<std::string> args)
{
    if (transitionBrokerState(BrokerState::CREATED, BrokerState::CONFIGURING)) {
        auto result = parseArgs(std::move(args));
        if (result != 0) {
            setBrokerState(BrokerState::CREATED);
            if (result < 0) {
                throw(helics::InvalidParameter("invalid arguments in command line"));
            }
            return;
        }
        configureBase();
    }
}